

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Variable_addTwoEquivalentVariablesAndCount_Test::~Variable_addTwoEquivalentVariablesAndCount_Test
          (Variable_addTwoEquivalentVariablesAndCount_Test *this)

{
  Variable_addTwoEquivalentVariablesAndCount_Test *this_local;
  
  ~Variable_addTwoEquivalentVariablesAndCount_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Variable, addTwoEquivalentVariablesAndCount)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v1, v3);
    const size_t e = 2;
    size_t a = v1->equivalentVariableCount();
    EXPECT_EQ(e, a);
}